

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen_xywh.cxx
# Opt level: O1

int Fl::screen_num(int x,int y,int w,int h)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  float fVar12;
  float fVar13;
  
  iVar7 = w + x;
  iVar6 = h + y;
  uVar11 = 0;
  fVar13 = 0.0;
  uVar10 = 0;
  while( true ) {
    if (num_screens < 0) {
      screen_init();
    }
    if ((int)(num_screens + (uint)(num_screens == 0)) <= (int)uVar11) break;
    if (num_screens < 0) {
      screen_init();
    }
    if (num_screens < 1) {
      iVar8 = 0;
      iVar4 = 0;
      iVar5 = 0;
      iVar2 = 0;
    }
    else {
      uVar3 = 0;
      if (uVar11 < (uint)num_screens) {
        uVar3 = (ulong)uVar11;
      }
      iVar8 = (int)screens[uVar3].x_org;
      iVar4 = (int)screens[uVar3].y_org;
      iVar5 = (int)screens[uVar3].width;
      iVar2 = (int)screens[uVar3].height;
    }
    fVar12 = 0.0;
    if ((((iVar8 <= iVar7) && (iVar5 = iVar5 + iVar8, x <= iVar5)) && (iVar4 <= iVar6)) &&
       (iVar2 = iVar2 + iVar4, y <= iVar2)) {
      iVar9 = x;
      if (x <= iVar8) {
        iVar9 = iVar8;
      }
      iVar8 = iVar7;
      if (iVar5 <= iVar7) {
        iVar8 = iVar5;
      }
      iVar5 = y;
      if (y <= iVar4) {
        iVar5 = iVar4;
      }
      iVar4 = iVar6;
      if (iVar2 <= iVar6) {
        iVar4 = iVar2;
      }
      fVar12 = (float)(iVar4 - iVar5) * (float)(iVar8 - iVar9);
    }
    uVar1 = uVar11;
    if (fVar12 <= fVar13) {
      fVar12 = fVar13;
      uVar1 = uVar10;
    }
    uVar11 = uVar11 + 1;
    fVar13 = fVar12;
    uVar10 = uVar1;
  }
  return uVar10;
}

Assistant:

int Fl::screen_num(int x, int y, int w, int h) {
  int best_screen = 0;
  float best_intersection = 0.;
  for (int i = 0; i < Fl::screen_count(); i++) {
    int sx = 0, sy = 0, sw = 0, sh = 0;
    Fl::screen_xywh(sx, sy, sw, sh, i);
    float sintersection = fl_intersection(x, y, w, h, sx, sy, sw, sh);
    if (sintersection > best_intersection) {
      best_screen = i;
      best_intersection = sintersection;
    }
  }
  return best_screen;
}